

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O3

potVec * __thiscall
OpenMD::Stats::getPotVecError(potVec *__return_storage_ptr__,Stats *this,int index)

{
  PotVecAccumulator *this_00;
  
  __return_storage_ptr__->data_[4] = 0.0;
  __return_storage_ptr__->data_[5] = 0.0;
  __return_storage_ptr__->data_[2] = 0.0;
  __return_storage_ptr__->data_[3] = 0.0;
  __return_storage_ptr__->data_[0] = 0.0;
  __return_storage_ptr__->data_[1] = 0.0;
  __return_storage_ptr__->data_[6] = 0.0;
  this_00 = (PotVecAccumulator *)
            __dynamic_cast((this->data_).
                           super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                           ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                           &BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo,0);
  PotVecAccumulator::get95percentConfidenceInterval(this_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

potVec Stats::getPotVecError(int index) {
    assert(index >= 0 && index < ENDINDEX);
    potVec value;
    dynamic_cast<PotVecAccumulator*>(data_[index].accumulator)
        ->get95percentConfidenceInterval(value);
    return value;
  }